

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O0

value * mjs::string_replace(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                           string *str,value *search_value,value *replace_value)

{
  undefined8 h_00;
  bool bVar1;
  value_type vVar2;
  regexp_flag rVar3;
  global_object *pgVar4;
  gc_heap_ptr_untyped *this;
  object_ptr *p;
  regexp_object *prVar5;
  object *poVar6;
  undefined1 auVar7 [16];
  wstring_view __str;
  value local_218;
  string local_1f0;
  value local_1e0;
  string local_1b8;
  value local_1a8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_180;
  string local_170;
  undefined1 local_160 [8];
  object_ptr match;
  wstring_view local_140;
  size_type local_130;
  size_type idx;
  string search_string;
  string local_100;
  undefined1 local_f0 [8];
  value match_1;
  gc_heap_ptr<mjs::regexp_object> re;
  object_ptr o;
  value local_98;
  undefined1 local_60 [8];
  value replace_val;
  gc_heap *h;
  value *replace_value_local;
  value *search_value_local;
  string *str_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  pgVar4 = gc_heap_ptr<mjs::global_object>::operator->(global);
  replace_val.field_1._24_8_ = object::heap(&pgVar4->super_object);
  value::value((value *)local_60,replace_value);
  vVar2 = value::type((value *)local_60);
  if (vVar2 == object) {
    this = &value::object_value((value *)local_60)->super_gc_heap_ptr_untyped;
    bVar1 = gc_heap_ptr_untyped::has_type<mjs::function_object>(this);
    if (!bVar1) goto LAB_001add2e;
  }
  else {
LAB_001add2e:
    to_string((mjs *)&o.super_gc_heap_ptr_untyped.pos_,(gc_heap *)replace_val.field_1._24_8_,
              (value *)local_60);
    value::value(&local_98,(string *)&o.super_gc_heap_ptr_untyped.pos_);
    value::operator=((value *)local_60,&local_98);
    value::~value(&local_98);
    string::~string((string *)&o.super_gc_heap_ptr_untyped.pos_);
  }
  vVar2 = value::type(search_value);
  if (vVar2 == object) {
    p = value::object_value(search_value);
    gc_heap_ptr<mjs::object>::gc_heap_ptr
              ((gc_heap_ptr<mjs::object> *)&re.super_gc_heap_ptr_untyped.pos_,p);
    bVar1 = gc_heap_ptr_untyped::has_type<mjs::regexp_object>
                      ((gc_heap_ptr_untyped *)&re.super_gc_heap_ptr_untyped.pos_);
    if (bVar1) {
      gc_heap_ptr<mjs::regexp_object>::gc_heap_ptr<mjs::object,void,void>
                ((gc_heap_ptr<mjs::regexp_object> *)
                 &match_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_,
                 (gc_heap_ptr<mjs::object> *)&re.super_gc_heap_ptr_untyped.pos_);
      prVar5 = gc_heap_ptr<mjs::regexp_object>::operator->
                         ((gc_heap_ptr<mjs::regexp_object> *)
                          &match_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                           super_gc_heap_ptr_untyped.pos_);
      rVar3 = regexp_object::flags(prVar5);
      rVar3 = operator&(rVar3,global);
      if (rVar3 == none) {
        prVar5 = gc_heap_ptr<mjs::regexp_object>::operator->
                           ((gc_heap_ptr<mjs::regexp_object> *)
                            &match_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                             super_gc_heap_ptr_untyped.pos_);
        regexp_object::exec((value *)local_f0,prVar5,str);
        anon_unknown_35::do_replace
                  ((anon_unknown_35 *)&local_100,str,(value *)local_f0,(value *)local_60);
        value::value(__return_storage_ptr__,&local_100);
        string::~string(&local_100);
        value::~value((value *)local_f0);
      }
      else {
        anon_unknown_35::do_global_replace
                  ((anon_unknown_35 *)
                   &search_string.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_,
                   str,(gc_heap_ptr<mjs::regexp_object> *)
                       &match_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                        super_gc_heap_ptr_untyped.pos_,(value *)local_60);
        value::value(__return_storage_ptr__,
                     (string *)
                     &search_string.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
                    );
        string::~string((string *)
                        &search_string.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                         pos_);
      }
      bVar1 = true;
      gc_heap_ptr<mjs::regexp_object>::~gc_heap_ptr
                ((gc_heap_ptr<mjs::regexp_object> *)
                 &match_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                  super_gc_heap_ptr_untyped.pos_);
    }
    else {
      bVar1 = false;
    }
    gc_heap_ptr<mjs::object>::~gc_heap_ptr
              ((gc_heap_ptr<mjs::object> *)&re.super_gc_heap_ptr_untyped.pos_);
    if (bVar1) goto LAB_001ae3e8;
  }
  to_string((mjs *)&idx,(gc_heap *)replace_val.field_1._24_8_,search_value);
  local_140 = string::view(str);
  __str = string::view((string *)&idx);
  match.super_gc_heap_ptr_untyped._8_8_ = __str._M_len;
  local_130 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::find(&local_140,__str,0);
  if (local_130 == 0xffffffffffffffff) {
    value::value(__return_storage_ptr__,str);
  }
  else {
    make_array((mjs *)local_160,global,0);
    poVar6 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_160);
    h_00 = replace_val.field_1._24_8_;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view(&local_180,L"0");
    string::string(&local_170,(gc_heap *)h_00,&local_180);
    value::value(&local_1a8,(string *)&idx);
    (*poVar6->_vptr_object[1])(poVar6,&local_170,&local_1a8,0);
    value::~value(&local_1a8);
    string::~string(&local_170);
    poVar6 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_160);
    pgVar4 = gc_heap_ptr<mjs::global_object>::operator->(global);
    (*(pgVar4->super_object)._vptr_object[0x13])(&local_1b8,pgVar4,"index");
    auVar7._8_4_ = (int)(local_130 >> 0x20);
    auVar7._0_8_ = local_130;
    auVar7._12_4_ = 0x45300000;
    value::value(&local_1e0,
                 (auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_130) - 4503599627370496.0));
    (*poVar6->_vptr_object[1])(poVar6,&local_1b8,&local_1e0,0);
    value::~value(&local_1e0);
    string::~string(&local_1b8);
    value::value(&local_218,(object_ptr *)local_160);
    anon_unknown_35::do_replace((anon_unknown_35 *)&local_1f0,str,&local_218,(value *)local_60);
    value::value(__return_storage_ptr__,&local_1f0);
    string::~string(&local_1f0);
    value::~value(&local_218);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_160);
  }
  string::~string((string *)&idx);
LAB_001ae3e8:
  value::~value((value *)local_60);
  return __return_storage_ptr__;
}

Assistant:

value string_replace(const gc_heap_ptr<global_object>& global, const string& str, const value& search_value, const value& replace_value) {
    auto& h = global->heap();

    value replace_val = replace_value;
    if (replace_val.type() != value_type::object || !replace_val.object_value().has_type<function_object>()) {
        replace_val = value{to_string(h, replace_val)};
    }

    if (search_value.type() == value_type::object) {
        auto o = search_value.object_value();
        if (o.has_type<regexp_object>()) {
            gc_heap_ptr<regexp_object> re{o};
            if ((re->flags() & regexp_flag::global) == regexp_flag::none) {
                auto match = re->exec(str);
                return value{do_replace(str, match, replace_val)};
            }
            return value{do_global_replace(str, re, replace_val)};
        }
    }

    auto search_string = to_string(h, search_value);
    auto idx = str.view().find(search_string.view());
    if (idx == std::wstring_view::npos) {
        return value{str};
    }
    // Fake up a match object
    auto match = make_array(global, 0);
    match->put(string{h, L"0"}, value{search_string});
    match->put(global->common_string("index"), value{static_cast<double>(idx)});

    return value{do_replace(str, value{match}, replace_val)};
}